

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<cs::tree_type<cs::token_base_*>_>::duplicate
          (holder<cs::tree_type<cs::token_base_*>_> *this)

{
  int iVar1;
  baseHolder *pbVar2;
  undefined4 extraout_var;
  
  if ((DAT_00344538 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar2 = *(baseHolder **)(&holder<cs::lang_error>::allocator + DAT_00344538 * 8);
    DAT_00344538 = DAT_00344538 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__holder_003330c0;
  iVar1 = cs::tree_type<cs::token_base_*>::copy
                    ((EVP_PKEY_CTX *)(this->mDat).mRoot,(EVP_PKEY_CTX *)0x0);
  pbVar2[1]._vptr_baseHolder = (_func_int **)CONCAT44(extraout_var,iVar1);
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}